

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O0

void __thiscall bsplib::Rdma::write_gets(Rdma *this)

{
  void *__dest;
  reference pvVar1;
  size_t sVar2;
  reference ppvVar3;
  void *__src;
  char *dst_addr;
  size_t slot;
  size_t size;
  size_t start;
  Rdma *pRStack_10;
  int p;
  Rdma *this_local;
  
  pRStack_10 = this;
  for (start._4_4_ = 0; start._4_4_ < this->m_nprocs; start._4_4_ = start._4_4_ + 1) {
    pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&(this->m_recv_actions).m_get_buffer_offset,(long)start._4_4_);
    size = *pvVar1;
    A2A::recv_pop(&this->m_second_exchange,start._4_4_,size);
    while( true ) {
      sVar2 = A2A::recv_size(&this->m_second_exchange,start._4_4_);
      if (sVar2 == 0) break;
      deserial<unsigned_long>(&this->m_second_exchange,start._4_4_,&slot);
      deserial<unsigned_long>(&this->m_second_exchange,start._4_4_,(unsigned_long *)&dst_addr);
      ppvVar3 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                          (&this->m_local_slots,(size_type)dst_addr);
      __dest = *ppvVar3;
      __src = A2A::recv_top(&this->m_second_exchange,start._4_4_);
      memcpy(__dest,__src,slot);
      A2A::recv_pop(&this->m_second_exchange,start._4_4_,slot);
    }
  }
  return;
}

Assistant:

void Rdma::write_gets()
{
#ifdef PROFILE
    TicToc t(TicToc::GET );
#endif
    for (int p = 0; p < m_nprocs; ++p){
        size_t start = m_recv_actions.m_get_buffer_offset[p];
        m_second_exchange.recv_pop( p, start );
        while ( m_second_exchange.recv_size( p ) > 0 ) {
            size_t size, slot;
            deserial( m_second_exchange, p, size );
            deserial( m_second_exchange, p, slot);
           
            char * dst_addr = static_cast<char *>(m_local_slots[ slot ]);

            std::memcpy( dst_addr, m_second_exchange.recv_top(p), size );
            m_second_exchange.recv_pop(p, size );
        }
#ifdef PROFILE
        size_t end = m_second_exchange.recv_pos(p);
        t.add_bytes( end - start );
#endif
   }
}